

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_dss_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  EVP_MD_CTX *local_58;
  DSA *local_50;
  uchar local_48 [24];
  
  local_50 = (DSA *)*abstract;
  puVar2 = (uchar *)_libssh2_calloc(session,0x28);
  *signature = puVar2;
  iVar3 = -1;
  if (puVar2 != (uchar *)0x0) {
    *signature_len = 0x28;
    _libssh2_sha1_init((EVP_MD_CTX **)&local_58);
    if (0 < veccount) {
      lVar4 = 0;
      do {
        EVP_DigestUpdate(local_58,*(void **)((long)&datavec->iov_base + lVar4),
                         *(size_t *)((long)&datavec->iov_len + lVar4));
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar4);
    }
    iVar3 = 0;
    EVP_DigestFinal(local_58,local_48,(uint *)0x0);
    EVP_MD_CTX_free(local_58);
    iVar1 = _libssh2_dsa_sha1_sign(local_50,local_48,0x14,*signature);
    if (iVar1 != 0) {
      (*session->free)(*signature,&session->abstract);
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

static int
hostkey_method_ssh_dss_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;
    int i;

    *signature = LIBSSH2_CALLOC(session, 2 * SHA_DIGEST_LENGTH);
    if(!*signature) {
        return -1;
    }

    *signature_len = 2 * SHA_DIGEST_LENGTH;

    (void)libssh2_sha1_init(&ctx);
    for(i = 0; i < veccount; i++) {
        libssh2_sha1_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha1_final(ctx, hash);

    if(_libssh2_dsa_sha1_sign(dsactx, hash, SHA_DIGEST_LENGTH, *signature)) {
        LIBSSH2_FREE(session, *signature);
        return -1;
    }

    return 0;
}